

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

CNode * __thiscall
CConnman::ConnectNode
          (CConnman *this,CAddress *addrConnect,char *pszDest,bool fCountFailure,
          ConnectionType conn_type,bool use_v2transport)

{
  string_view in;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  __normal_iterator<CService_*,_std::vector<CService,_std::allocator<CService>_>_> __first;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  bool bVar1;
  bool bVar2;
  uint16_t uVar3;
  CNode *pCVar4;
  reference pCVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  shared_ptr<Sock> *in_RSI;
  long in_RDI;
  int in_R8D;
  byte in_R9B;
  long in_FS_OFFSET;
  CNode *pnode_2;
  uint64_t nonce;
  NodeId id;
  bool connected;
  bool use_proxy;
  CAddress *target_addr;
  vector<CAddress,_std::allocator<CAddress>_> *__range1;
  CNode *pnode_1;
  CService *r;
  vector<CService,_std::allocator<CService>_> *__range3;
  uint16_t default_port;
  CNode *pnode;
  vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> whitelist_permissions;
  NetPermissionFlags permission_flags;
  bool proxyConnectionFailed_1;
  uint16_t port;
  bool proxyConnectionFailed;
  iterator __end1;
  iterator __begin1;
  unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> i2p_transient_session;
  unique_ptr<Sock,_std::default_delete<Sock>_> sock;
  iterator __end3;
  iterator __begin3;
  vector<CService,_std::allocator<CService>_> resolved;
  vector<CAddress,_std::allocator<CAddress>_> connect_to;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock29;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock28;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock27;
  string host;
  Connection conn;
  CAddress addr_bind;
  Proxy proxy;
  CNode *in_stack_fffffffffffff698;
  undefined4 uVar6;
  char *in_stack_fffffffffffff6a0;
  duration<long,_std::ratio<1L,_1L>_> in_stack_fffffffffffff6a8;
  __native_type *in_stack_fffffffffffff6b0;
  NodeSeconds in_stack_fffffffffffff6b8;
  CService *in_stack_fffffffffffff6c0;
  CConnman *in_stack_fffffffffffff6c8;
  CConnman *in_stack_fffffffffffff6d0;
  undefined4 in_stack_fffffffffffff6d8;
  undefined4 in_stack_fffffffffffff6dc;
  CNetAddr *in_stack_fffffffffffff6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>
  *in_stack_fffffffffffff6f0;
  FastRandomContext *in_stack_fffffffffffff700;
  undefined4 in_stack_fffffffffffff708;
  int in_stack_fffffffffffff70c;
  CService *in_stack_fffffffffffff710;
  string *in_stack_fffffffffffff718;
  Proxy *in_stack_fffffffffffff720;
  undefined8 in_stack_fffffffffffff748;
  __normal_iterator<CService_*,_std::vector<CService,_std::allocator<CService>_>_>
  in_stack_fffffffffffff750;
  undefined7 in_stack_fffffffffffff758;
  undefined1 in_stack_fffffffffffff75f;
  size_t in_stack_fffffffffffff760;
  reference in_stack_fffffffffffff768;
  bool *in_stack_fffffffffffff790;
  Connection *in_stack_fffffffffffff798;
  undefined7 in_stack_fffffffffffff7a0;
  undefined1 in_stack_fffffffffffff7a7;
  Session *in_stack_fffffffffffff7a8;
  Level level;
  type in_stack_fffffffffffff840;
  hours in_stack_fffffffffffff850;
  undefined8 in_stack_fffffffffffff858;
  double *in_stack_fffffffffffff860;
  __native_type *in_stack_fffffffffffff868;
  undefined1 inbound_onion;
  __native_type *in_stack_fffffffffffff870;
  __native_type *p_Var7;
  undefined1 *in_stack_fffffffffffff878;
  CAddress *in_stack_fffffffffffff880;
  undefined7 in_stack_fffffffffffff898;
  undefined1 uVar8;
  bool local_722;
  value_type *in_stack_fffffffffffff8f0;
  CNode *in_stack_fffffffffffff8f8;
  ConnectionType in_stack_fffffffffffff900;
  CNodeOptions *in_stack_fffffffffffff910;
  bool local_6c9;
  CNode *local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_671;
  int local_644;
  CService local_633;
  pointer local_600;
  long local_5f8;
  byte local_5e1;
  CAddress *local_5e0;
  CAddress *local_5d8;
  CService *local_580;
  CService *local_578;
  allocator<char> local_549 [25];
  undefined1 local_530 [31];
  allocator<char> local_511;
  duration local_510;
  rep local_508;
  rep local_500;
  undefined1 local_4f8 [15];
  double local_4e9 [8];
  __native_type local_4a8;
  byte local_480;
  undefined1 local_360 [248];
  undefined1 local_268 [568];
  undefined1 local_30 [40];
  atomic<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> local_8;
  
  local_8._M_i.__r = *(duration<long,_std::ratio<1L,_1000000L>_> *)(in_FS_OFFSET + 0x28);
  local_4a8.__align = (long)in_RDX;
  AssertLockNotHeldInline
            ((char *)in_stack_fffffffffffff6a8.__r,in_stack_fffffffffffff6a0,
             (int)((ulong)in_stack_fffffffffffff698 >> 0x20),(Mutex *)0xff6849);
  if (in_R8D == 0) {
    __assert_fail("conn_type != ConnectionType::INBOUND",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                  ,0x187,
                  "CNode *CConnman::ConnectNode(CAddress, const char *, bool, ConnectionType, bool)"
                 );
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8.__align ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = IsLocal((CService *)in_stack_fffffffffffff6b8.__d.__r);
    if (bVar1) {
      local_680 = (CNode *)0x0;
      goto LAB_00ff8616;
    }
    in_stack_fffffffffffff878 = local_30;
    CService::CService((CService *)in_stack_fffffffffffff6a8.__r,
                       (CService *)in_stack_fffffffffffff6a0);
    pCVar4 = FindNode((CConnman *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8),
                      (CService *)in_stack_fffffffffffff6d0);
    CService::~CService((CService *)in_stack_fffffffffffff698);
    level = (Level)in_stack_fffffffffffff840.__r;
    if (pCVar4 != (CNode *)0x0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 in_stack_fffffffffffff6b8.__d.__r,in_stack_fffffffffffff6b0->__size);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 in_stack_fffffffffffff6b8.__d.__r,in_stack_fffffffffffff6b0->__size);
      logging_function._M_str = (char *)in_stack_fffffffffffff768;
      logging_function._M_len = in_stack_fffffffffffff760;
      source_file._M_str._0_7_ = in_stack_fffffffffffff758;
      source_file._M_len = (size_t)in_stack_fffffffffffff750._M_current;
      source_file._M_str._7_1_ = in_stack_fffffffffffff75f;
      LogPrintFormatInternal<>
                (logging_function,source_file,in_stack_fffffffffffff70c,
                 (LogFlags)in_stack_fffffffffffff700,level,
                 (ConstevalFormatString<0U>)in_stack_fffffffffffff748);
      local_680 = (CNode *)0x0;
      goto LAB_00ff8616;
    }
    in_stack_fffffffffffff880 = (CAddress *)0x0;
  }
  bVar1 = ::LogAcceptCategory((LogFlags)in_stack_fffffffffffff698,Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff6b8.__d.__r
               ,in_stack_fffffffffffff6b0->__size);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff6b8.__d.__r
               ,in_stack_fffffffffffff6b0->__size);
    if ((in_R9B & 1) == 0) {
      p_Var7 = (__native_type *)0x1c1c1f6;
    }
    else {
      p_Var7 = (__native_type *)0x1bf4ae8;
    }
    local_6c9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4a8.__align ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    in_stack_fffffffffffff870 = p_Var7;
    if (local_6c9) {
      CService::ToStringAddrPort_abi_cxx11_((CService *)in_stack_fffffffffffff6d0);
    }
    else {
      in_stack_fffffffffffff860 = local_4e9;
      in_stack_fffffffffffff858 = local_4a8.__align;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff6e8,(char *)in_stack_fffffffffffff6e0,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
    }
    local_6c9 = !local_6c9;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8.__align ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      local_510.__r =
           (rep)Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                          ();
      in_stack_fffffffffffff840 =
           std::chrono::operator-
                     ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                      in_stack_fffffffffffff6a0,
                      (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                      in_stack_fffffffffffff698);
      uVar6 = (undefined4)((ulong)in_stack_fffffffffffff698 >> 0x20);
      local_500 = in_stack_fffffffffffff840.__r;
    }
    else {
      in_stack_fffffffffffff850 = h<(char)48>();
      local_508 = in_stack_fffffffffffff850.__r;
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,std::ratio<3600l,1l>,void>
                ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffff6a0,
                 (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_fffffffffffff698);
      uVar6 = (undefined4)((ulong)in_stack_fffffffffffff698 >> 0x20);
    }
    local_4f8._0_8_ =
         Ticks<std::chrono::duration<double,std::ratio<3600l,1l>>,std::chrono::duration<long,std::ratio<1l,1l>>>
                   (in_stack_fffffffffffff6a8);
    in_stack_fffffffffffff6a8.__r = (rep)p_Var7;
    in_stack_fffffffffffff6b8.__d.__r = (duration)local_4f8;
    in_stack_fffffffffffff6b0 = (__native_type *)(local_268 + 0x218);
    in_stack_fffffffffffff6a0 = "trying %s connection %s lastseen=%.1fhrs\n";
    in_stack_fffffffffffff698 = (CNode *)CONCAT44(uVar6,1);
    logging_function_00._M_str = (char *)in_stack_fffffffffffff768;
    logging_function_00._M_len = in_stack_fffffffffffff760;
    source_file_00._M_str._0_7_ = in_stack_fffffffffffff758;
    source_file_00._M_len = (size_t)in_stack_fffffffffffff750._M_current;
    source_file_00._M_str._7_1_ = in_stack_fffffffffffff75f;
    in_stack_fffffffffffff868 = (__native_type *)in_stack_fffffffffffff6a8.__r;
    LogPrintFormatInternal<char[3],std::__cxx11::string,double>
              (logging_function_00,source_file_00,in_stack_fffffffffffff70c,
               (LogFlags)in_stack_fffffffffffff700,(Level)in_stack_fffffffffffff840.__r,
               (ConstevalFormatString<3U>)in_stack_fffffffffffff748,
               (char (*) [3])in_stack_fffffffffffff850.__r,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff858,in_stack_fffffffffffff860);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff698);
    if (local_6c9) {
      std::allocator<char>::~allocator((allocator<char> *)local_4e9);
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8.__align ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    uVar3 = CChainParams::GetDefaultPort((CChainParams *)in_stack_fffffffffffff698);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6e8,(char *)in_stack_fffffffffffff6e0,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
    uVar3 = GetDefaultPort((CConnman *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8)
                           ,(string *)in_stack_fffffffffffff6d0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff698);
    std::allocator<char>::~allocator(&local_511);
  }
  memset(local_530,0,0x18);
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff698);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8.__align ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::vector<CAddress,_std::allocator<CAddress>_>::push_back
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff6a8.__r,
               (value_type *)in_stack_fffffffffffff6a0);
LAB_00ff75dc:
    std::unique_ptr<Sock,std::default_delete<Sock>>::unique_ptr<std::default_delete<Sock>,void>
              ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffff698);
    Proxy::Proxy((Proxy *)in_stack_fffffffffffff698);
    CAddress::CAddress((CAddress *)in_stack_fffffffffffff6b8.__d.__r);
    bVar1 = CNetAddr::IsValid((CNetAddr *)&in_stack_fffffffffffff6b0->__data);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!addr_bind.IsValid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                    ,0x1c5,
                    "CNode *CConnman::ConnectNode(CAddress, const char *, bool, ConnectionType, bool)"
                   );
    }
    std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>::
    unique_ptr<std::default_delete<i2p::sam::Session>,void>
              ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
               in_stack_fffffffffffff698);
    local_5d8 = (CAddress *)
                std::vector<CAddress,_std::allocator<CAddress>_>::begin
                          ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff6a0)
    ;
    local_5e0 = (CAddress *)
                std::vector<CAddress,_std::allocator<CAddress>_>::end
                          ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff6a0)
    ;
    while (bVar1 = __gnu_cxx::
                   operator==<CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_>
                             ((__normal_iterator<CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_>
                               *)in_stack_fffffffffffff6a8.__r,
                              (__normal_iterator<CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_>
                               *)in_stack_fffffffffffff6a0), ((bVar1 ^ 0xffU) & 1) != 0) {
      pCVar5 = __gnu_cxx::
               __normal_iterator<CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_>::
               operator*((__normal_iterator<CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_>
                          *)in_stack_fffffffffffff698);
      bVar1 = CNetAddr::IsValid((CNetAddr *)&in_stack_fffffffffffff6b0->__data);
      if (bVar1) {
        CNetAddr::GetNetwork((CNetAddr *)in_stack_fffffffffffff6a0);
        bVar1 = GetProxy(SUB84(in_stack_fffffffffffff6b8.__d.__r,0),
                         (Proxy *)&in_stack_fffffffffffff6b0->__data);
        local_5e1 = 0;
        bVar2 = CNetAddr::IsI2P((CNetAddr *)in_stack_fffffffffffff698);
        if ((bVar2) && (bVar1)) {
          i2p::Connection::Connection((Connection *)in_stack_fffffffffffff6c8);
          bVar1 = std::unique_ptr::operator_cast_to_bool
                            ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                              *)in_stack_fffffffffffff698);
          if (bVar1) {
            std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::operator->
                      ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
                       in_stack_fffffffffffff698);
            local_722 = i2p::sam::Session::Connect
                                  (in_stack_fffffffffffff7a8,
                                   (CService *)
                                   CONCAT17(in_stack_fffffffffffff7a7,in_stack_fffffffffffff7a0),
                                   in_stack_fffffffffffff798,in_stack_fffffffffffff790);
          }
          else {
            MaybeCheckNotHeld((Mutex *)in_stack_fffffffffffff698);
            UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                      ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
                       CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8),
                       &in_stack_fffffffffffff6d0->m_total_bytes_sent_mutex,
                       (char *)in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,
                       (int)((ulong)in_stack_fffffffffffff6b8.__d.__r >> 0x20),
                       SUB81((ulong)in_stack_fffffffffffff6b8.__d.__r >> 0x18,0));
            bVar1 = std::
                    queue<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::deque<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>_>
                    ::empty((queue<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::deque<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>_>
                             *)in_stack_fffffffffffff698);
            if (bVar1) {
              local_5f8 = in_RDI + 0x308;
              std::make_unique<i2p::sam::Session,Proxy&,CThreadInterrupt*>
                        ((Proxy *)in_stack_fffffffffffff6d0,
                         (CThreadInterrupt **)in_stack_fffffffffffff6c8);
              std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::operator=
                        ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
                         in_stack_fffffffffffff6a8.__r,
                         (unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
                         in_stack_fffffffffffff6a0);
              std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::
              ~unique_ptr((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
                          in_stack_fffffffffffff6a8.__r);
            }
            else {
              in_stack_fffffffffffff7a8 =
                   (Session *)
                   std::
                   queue<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::deque<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>_>
                   ::front((queue<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::deque<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>_>
                            *)in_stack_fffffffffffff698);
              std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::swap
                        ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
                         in_stack_fffffffffffff698,
                         (unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
                         0xff79b4);
              std::
              queue<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::deque<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>_>
              ::pop((queue<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::deque<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>_>
                     *)in_stack_fffffffffffff698);
            }
            UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
                      ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffff698);
            std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::operator->
                      ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
                       in_stack_fffffffffffff698);
            local_722 = i2p::sam::Session::Connect
                                  (in_stack_fffffffffffff7a8,
                                   (CService *)
                                   CONCAT17(in_stack_fffffffffffff7a7,in_stack_fffffffffffff7a0),
                                   in_stack_fffffffffffff798,in_stack_fffffffffffff790);
            in_stack_fffffffffffff7a7 = local_722;
            if (!local_722) {
              in_stack_fffffffffffff798 =
                   (Connection *)MaybeCheckNotHeld((Mutex *)in_stack_fffffffffffff698);
              UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                        ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
                         CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8),
                         &in_stack_fffffffffffff6d0->m_total_bytes_sent_mutex,
                         (char *)in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,
                         (int)((ulong)in_stack_fffffffffffff6b8.__d.__r >> 0x20),
                         SUB81((ulong)in_stack_fffffffffffff6b8.__d.__r >> 0x18,0));
              in_stack_fffffffffffff790 =
                   (bool *)std::
                           queue<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::deque<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>_>
                           ::size((queue<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::deque<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>_>
                                   *)in_stack_fffffffffffff698);
              if (in_stack_fffffffffffff790 < (bool *)0xa) {
                local_600 = std::
                            unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::
                            release((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                                     *)in_stack_fffffffffffff698);
                std::
                queue<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>,std::deque<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>,std::allocator<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>>>>
                ::emplace<i2p::sam::Session*>
                          ((queue<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::deque<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>_>
                            *)in_stack_fffffffffffff6a8.__r,(Session **)in_stack_fffffffffffff6a0);
              }
              UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
                        ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffff698);
            }
          }
          if (local_722 != false) {
            std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator=
                      ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffff6a8.__r
                       ,(unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffff6a0);
            CService::CService((CService *)in_stack_fffffffffffff6a8.__r,
                               (CService *)in_stack_fffffffffffff6a0);
            CAddress::CAddress((CAddress *)in_stack_fffffffffffff6c8,in_stack_fffffffffffff6c0,
                               (ServiceFlags)in_stack_fffffffffffff6b8.__d.__r);
            CAddress::operator=((CAddress *)in_stack_fffffffffffff6a8.__r,
                                (CAddress *)in_stack_fffffffffffff6a0);
            CAddress::~CAddress((CAddress *)in_stack_fffffffffffff698);
            CService::~CService((CService *)in_stack_fffffffffffff698);
          }
          i2p::Connection::~Connection((Connection *)in_stack_fffffffffffff698);
        }
        else if (bVar1) {
          bVar1 = ::LogAcceptCategory((LogFlags)in_stack_fffffffffffff698,Trace);
          if (bVar1) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       in_stack_fffffffffffff6b8.__d.__r,in_stack_fffffffffffff6b0->__size);
            uVar6 = (undefined4)((ulong)in_stack_fffffffffffff698 >> 0x20);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       in_stack_fffffffffffff6b8.__d.__r,in_stack_fffffffffffff6b0->__size);
            Proxy::ToString_abi_cxx11_((Proxy *)&in_stack_fffffffffffff6b0->__data);
            CService::ToStringAddrPort_abi_cxx11_((CService *)in_stack_fffffffffffff6d0);
            in_stack_fffffffffffff6b0 = (__native_type *)local_360;
            in_stack_fffffffffffff6a8.__r = (rep)(local_360 + 0x20);
            in_stack_fffffffffffff6a0 = "Using proxy: %s to connect to %s\n";
            in_stack_fffffffffffff698 = (CNode *)CONCAT44(uVar6,1);
            logging_function_03._M_str = (char *)in_stack_fffffffffffff768;
            logging_function_03._M_len = in_stack_fffffffffffff760;
            source_file_03._M_str._0_7_ = in_stack_fffffffffffff758;
            source_file_03._M_len = (size_t)in_stack_fffffffffffff750._M_current;
            source_file_03._M_str._7_1_ = in_stack_fffffffffffff75f;
            LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                      (logging_function_03,source_file_03,in_stack_fffffffffffff70c,
                       (LogFlags)in_stack_fffffffffffff700,(Level)in_stack_fffffffffffff840.__r,
                       (ConstevalFormatString<2U>)in_stack_fffffffffffff748,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff850.__r,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff858);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff698);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff698);
          }
          CNetAddr::ToStringAddr_abi_cxx11_(in_stack_fffffffffffff6e0);
          CService::GetPort((CService *)in_stack_fffffffffffff698);
          ConnectThroughProxy(in_stack_fffffffffffff720,in_stack_fffffffffffff718,
                              (uint16_t)((ulong)in_stack_fffffffffffff710 >> 0x30),
                              (bool *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708))
          ;
          std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator=
                    ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffff6a8.__r,
                     (unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffff6a0);
          std::unique_ptr<Sock,_std::default_delete<Sock>_>::~unique_ptr
                    ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffff6a8.__r);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff698);
        }
        else {
          ConnectDirectly(in_stack_fffffffffffff710,SUB41((uint)in_stack_fffffffffffff70c >> 0x18,0)
                         );
          std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator=
                    ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffff6a8.__r,
                     (unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffff6a0);
          std::unique_ptr<Sock,_std::default_delete<Sock>_>::~unique_ptr
                    ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffff6a8.__r);
        }
        if ((local_5e1 & 1) == 0) {
          in_stack_fffffffffffff760 = *(size_t *)(in_RDI + 0xb0);
          Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
          AddrMan::Attempt((AddrMan *)in_stack_fffffffffffff6a8.__r,
                           (CService *)in_stack_fffffffffffff6a0,
                           SUB81((ulong)in_stack_fffffffffffff698 >> 0x38,0),
                           in_stack_fffffffffffff6b8);
          in_stack_fffffffffffff768 = pCVar5;
        }
      }
      else if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4a8.__align !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
              (in_stack_fffffffffffff75f = GetNameProxy((Proxy *)&in_stack_fffffffffffff6b0->__data)
              , (bool)in_stack_fffffffffffff75f)) {
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &in_stack_fffffffffffff6b0->__data);
        in_stack_fffffffffffff750._M_current = &local_633;
        in_stack_fffffffffffff748 = local_4a8.__align;
        local_633.super_CNetAddr.m_addr._union._1_2_ = uVar3;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff6e8,(char *)in_stack_fffffffffffff6e0,
                   (allocator<char> *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8))
        ;
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff6b8.__d.__r);
        in._M_str._0_4_ = in_stack_fffffffffffff708;
        in._M_len = (size_t)in_stack_fffffffffffff700;
        in._M_str._4_4_ = in_stack_fffffffffffff70c;
        SplitHostPort(in,(uint16_t *)in_stack_fffffffffffff6d0,(string *)in_stack_fffffffffffff6c8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff698);
        std::allocator<char>::~allocator((allocator<char> *)&local_633);
        ConnectThroughProxy(in_stack_fffffffffffff720,in_stack_fffffffffffff718,
                            (uint16_t)((ulong)in_stack_fffffffffffff710 >> 0x30),
                            (bool *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708));
        std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator=
                  ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffff6a8.__r,
                   (unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffff6a0);
        std::unique_ptr<Sock,_std::default_delete<Sock>_>::~unique_ptr
                  ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffff6a8.__r);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff698);
      }
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffff698);
      inbound_onion = (undefined1)((ulong)in_stack_fffffffffffff868 >> 0x38);
      if (bVar1) {
        local_644 = 0;
        if (in_R8D == 2) {
          std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::vector
                    (in_stack_fffffffffffff6f0,
                     (vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *)
                     in_stack_fffffffffffff6e8);
        }
        else {
          memset((void *)((long)&local_671.field_2 + 1),0,0x18);
          std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::vector
                    ((vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *)
                     in_stack_fffffffffffff698);
        }
        AddWhitelistPermissionFlags
                  (in_stack_fffffffffffff6c8,(NetPermissionFlags *)in_stack_fffffffffffff6c0,
                   (CNetAddr *)in_stack_fffffffffffff6b8.__d.__r,
                   (vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *)
                   &in_stack_fffffffffffff6b0->__data);
        GetNewNodeId((CConnman *)&in_stack_fffffffffffff6b0->__data);
        GetDeterministicRandomizer
                  ((CConnman *)in_stack_fffffffffffff6b8.__d.__r,(uint64_t)in_stack_fffffffffffff6b0
                  );
        CSipHasher::Write((CSipHasher *)in_stack_fffffffffffff6c8,
                          (uint64_t)in_stack_fffffffffffff6c0);
        CSipHasher::Finalize((CSipHasher *)in_stack_fffffffffffff6c8);
        bVar1 = CNetAddr::IsValid((CNetAddr *)&in_stack_fffffffffffff6b0->__data);
        if (!bVar1) {
          std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator*
                    ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffff6a8.__r);
          GetBindAddress((Sock *)in_stack_fffffffffffff6e8);
          CAddress::operator=((CAddress *)in_stack_fffffffffffff6a8.__r,
                              (CAddress *)in_stack_fffffffffffff6a0);
          CAddress::~CAddress((CAddress *)in_stack_fffffffffffff698);
        }
        uVar6 = (undefined4)((ulong)in_stack_fffffffffffff6a8.__r >> 0x20);
        local_680 = (CNode *)operator_new(0x3a8);
        uVar8 = 1;
        std::shared_ptr<Sock>::shared_ptr<Sock,std::default_delete<Sock>,void>
                  ((shared_ptr<Sock> *)in_stack_fffffffffffff698,
                   (unique_ptr<Sock,_std::default_delete<Sock>_> *)0xff82b8);
        CalculateKeyedNetGroup(in_stack_fffffffffffff6d0,(CAddress *)in_stack_fffffffffffff6c8);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8.__align
            == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          local_4a8.__align =
               (long)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1ccada1;
        }
        this_00 = &local_671;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_00,(char *)local_4a8.__align,
                   (allocator<char> *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8))
        ;
        local_4a8.__data.__owner = local_644;
        std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::unique_ptr
                  ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
                   in_stack_fffffffffffff698,
                   (unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
                   0xff8373);
        local_4a8.__size[0x18] = '\0';
        local_4a8.__data.__list.__next = (__pthread_internal_list *)(ulong)*(uint *)(in_RDI + 0x8c);
        in_stack_fffffffffffff6a8.__r = CONCAT44(uVar6,in_R8D);
        in_stack_fffffffffffff698 = (CNode *)local_268;
        local_480 = in_R9B & 1;
        CNode::CNode((CNode *)CONCAT17(uVar8,in_stack_fffffffffffff898),in_RDI,in_RSI,
                     in_stack_fffffffffffff880,(uint64_t)in_stack_fffffffffffff878,
                     (uint64_t)in_stack_fffffffffffff870,in_stack_fffffffffffff8f0,
                     (string *)in_stack_fffffffffffff8f8,in_stack_fffffffffffff900,
                     (bool)inbound_onion,in_stack_fffffffffffff910);
        CNodeOptions::~CNodeOptions((CNodeOptions *)in_stack_fffffffffffff698);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff698);
        std::allocator<char>::~allocator((allocator<char> *)&local_671);
        std::shared_ptr<Sock>::~shared_ptr((shared_ptr<Sock> *)in_stack_fffffffffffff698);
        CNode::AddRef(in_stack_fffffffffffff698);
        RandAddEvent((uint32_t)((ulong)in_stack_fffffffffffff698 >> 0x20));
        std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::~vector
                  ((vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *)
                   in_stack_fffffffffffff6a8.__r);
        goto LAB_00ff858c;
      }
      __gnu_cxx::__normal_iterator<CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_>::
      operator++((__normal_iterator<CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_> *
                 )in_stack_fffffffffffff698);
    }
    local_680 = (CNode *)0x0;
LAB_00ff858c:
    std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
              ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
               in_stack_fffffffffffff6a8.__r);
    CAddress::~CAddress((CAddress *)in_stack_fffffffffffff698);
    Proxy::~Proxy((Proxy *)in_stack_fffffffffffff698);
    std::unique_ptr<Sock,_std::default_delete<Sock>_>::~unique_ptr
              ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffff6a8.__r);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6e8,(char *)in_stack_fffffffffffff6e0,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
    if ((fNameLookup & 1U) != 0) {
      HaveNameProxy();
    }
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)in_stack_fffffffffffff6b8.__d.__r,
               (function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)&in_stack_fffffffffffff6b0->__data);
    Lookup((string *)in_stack_fffffffffffff720,(uint16_t)((ulong)in_stack_fffffffffffff718 >> 0x30),
           SUB81((ulong)in_stack_fffffffffffff718 >> 0x28,0),(uint)in_stack_fffffffffffff718,
           (DNSLookupFn *)in_stack_fffffffffffff710);
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::~function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                 *)in_stack_fffffffffffff698);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff698);
    std::allocator<char>::~allocator(local_549);
    bVar1 = std::vector<CService,_std::allocator<CService>_>::empty
                      ((vector<CService,_std::allocator<CService>_> *)in_stack_fffffffffffff6a8.__r)
    ;
    if (bVar1) {
      std::vector<CAddress,_std::allocator<CAddress>_>::push_back
                ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff6a8.__r,
                 (value_type *)in_stack_fffffffffffff6a0);
    }
    else {
      std::vector<CService,_std::allocator<CService>_>::begin
                ((vector<CService,_std::allocator<CService>_> *)in_stack_fffffffffffff6a0);
      std::vector<CService,_std::allocator<CService>_>::end
                ((vector<CService,_std::allocator<CService>_> *)in_stack_fffffffffffff6a0);
      FastRandomContext::FastRandomContext
                ((FastRandomContext *)in_stack_fffffffffffff6a8.__r,
                 SUB81((ulong)in_stack_fffffffffffff6a0 >> 0x38,0));
      __first._M_current._7_1_ = in_stack_fffffffffffff75f;
      __first._M_current._0_7_ = in_stack_fffffffffffff758;
      std::
      shuffle<__gnu_cxx::__normal_iterator<CService*,std::vector<CService,std::allocator<CService>>>,FastRandomContext>
                (__first,in_stack_fffffffffffff750,in_stack_fffffffffffff700);
      FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_fffffffffffff698);
      local_578 = (CService *)
                  std::vector<CService,_std::allocator<CService>_>::begin
                            ((vector<CService,_std::allocator<CService>_> *)
                             in_stack_fffffffffffff6a0);
      local_580 = (CService *)
                  std::vector<CService,_std::allocator<CService>_>::end
                            ((vector<CService,_std::allocator<CService>_> *)
                             in_stack_fffffffffffff6a0);
      while (bVar1 = __gnu_cxx::
                     operator==<CService_*,_std::vector<CService,_std::allocator<CService>_>_>
                               ((__normal_iterator<CService_*,_std::vector<CService,_std::allocator<CService>_>_>
                                 *)in_stack_fffffffffffff6a8.__r,
                                (__normal_iterator<CService_*,_std::vector<CService,_std::allocator<CService>_>_>
                                 *)in_stack_fffffffffffff6a0), ((bVar1 ^ 0xffU) & 1) != 0) {
        in_stack_fffffffffffff910 =
             (CNodeOptions *)
             __gnu_cxx::
             __normal_iterator<CService_*,_std::vector<CService,_std::allocator<CService>_>_>::
             operator*((__normal_iterator<CService_*,_std::vector<CService,_std::allocator<CService>_>_>
                        *)in_stack_fffffffffffff698);
        MaybeFlipIPv6toCJDNS((CService *)in_stack_fffffffffffff6d0);
        CAddress::CAddress((CAddress *)in_stack_fffffffffffff6c8,in_stack_fffffffffffff6c0,
                           (ServiceFlags)in_stack_fffffffffffff6b8.__d.__r);
        CAddress::operator=((CAddress *)in_stack_fffffffffffff6a8.__r,
                            (CAddress *)in_stack_fffffffffffff6a0);
        CAddress::~CAddress((CAddress *)in_stack_fffffffffffff698);
        CService::~CService((CService *)in_stack_fffffffffffff698);
        bVar1 = CNetAddr::IsValid((CNetAddr *)&in_stack_fffffffffffff6b0->__data);
        if (!bVar1) {
          bVar1 = ::LogAcceptCategory((LogFlags)in_stack_fffffffffffff698,Trace);
          if (bVar1) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       in_stack_fffffffffffff6b8.__d.__r,in_stack_fffffffffffff6b0->__size);
            uVar6 = (undefined4)((ulong)in_stack_fffffffffffff698 >> 0x20);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       in_stack_fffffffffffff6b8.__d.__r,in_stack_fffffffffffff6b0->__size);
            CService::ToStringAddrPort_abi_cxx11_((CService *)in_stack_fffffffffffff6d0);
            in_stack_fffffffffffff6b0 = &local_4a8;
            in_stack_fffffffffffff6a8.__r = (rep)(local_268 + 0xd0);
            in_stack_fffffffffffff6a0 = "Resolver returned invalid address %s for %s\n";
            in_stack_fffffffffffff698 = (CNode *)CONCAT44(uVar6,1);
            logging_function_01._M_str = (char *)in_stack_fffffffffffff768;
            logging_function_01._M_len = in_stack_fffffffffffff760;
            source_file_01._M_str._0_7_ = in_stack_fffffffffffff758;
            source_file_01._M_len = (size_t)in_stack_fffffffffffff750._M_current;
            source_file_01._M_str._7_1_ = in_stack_fffffffffffff75f;
            LogPrintFormatInternal<std::__cxx11::string,char_const*>
                      (logging_function_01,source_file_01,in_stack_fffffffffffff70c,
                       (LogFlags)in_stack_fffffffffffff700,(Level)in_stack_fffffffffffff840.__r,
                       (ConstevalFormatString<2U>)in_stack_fffffffffffff748,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff850.__r,(char **)in_stack_fffffffffffff858);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff698);
          }
          local_680 = (CNode *)0x0;
          bVar1 = true;
          goto LAB_00ff7574;
        }
        MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                  ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff698);
        UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                  ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                   CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8),
                   (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff6d0,
                   (char *)in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,
                   (int)((ulong)in_stack_fffffffffffff6b8.__d.__r >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffff6b8.__d.__r >> 0x18,0));
        CService::CService((CService *)in_stack_fffffffffffff6a8.__r,
                           (CService *)in_stack_fffffffffffff6a0);
        in_stack_fffffffffffff8f8 =
             FindNode((CConnman *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8),
                      (CService *)in_stack_fffffffffffff6d0);
        CService::~CService((CService *)in_stack_fffffffffffff698);
        bVar1 = in_stack_fffffffffffff8f8 == (CNode *)0x0;
        if (bVar1) {
          std::vector<CAddress,_std::allocator<CAddress>_>::push_back
                    ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff6a8.__r,
                     (value_type *)in_stack_fffffffffffff6a0);
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     in_stack_fffffffffffff6b8.__d.__r,in_stack_fffffffffffff6b0->__size);
          uVar6 = (undefined4)((ulong)in_stack_fffffffffffff698 >> 0x20);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     in_stack_fffffffffffff6b8.__d.__r,in_stack_fffffffffffff6b0->__size);
          in_stack_fffffffffffff6a0 = "Not opening a connection to %s, already connected to %s\n";
          CService::ToStringAddrPort_abi_cxx11_((CService *)in_stack_fffffffffffff6d0);
          in_stack_fffffffffffff6b0 = (__native_type *)(local_268 + 0x88);
          in_stack_fffffffffffff6a8.__r = (rep)&local_4a8;
          in_stack_fffffffffffff698 = (CNode *)CONCAT44(uVar6,2);
          logging_function_02._M_str = (char *)in_stack_fffffffffffff768;
          logging_function_02._M_len = in_stack_fffffffffffff760;
          source_file_02._M_str._0_7_ = in_stack_fffffffffffff758;
          source_file_02._M_len = (size_t)in_stack_fffffffffffff750._M_current;
          source_file_02._M_str._7_1_ = in_stack_fffffffffffff75f;
          in_stack_fffffffffffff8f0 = (value_type *)in_stack_fffffffffffff6a0;
          LogPrintFormatInternal<char_const*,std::__cxx11::string>
                    (logging_function_02,source_file_02,in_stack_fffffffffffff70c,
                     (LogFlags)in_stack_fffffffffffff700,(Level)in_stack_fffffffffffff840.__r,
                     (ConstevalFormatString<2U>)in_stack_fffffffffffff748,
                     (char **)in_stack_fffffffffffff850.__r,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff858);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff698);
          local_680 = (CNode *)0x0;
        }
        bVar1 = !bVar1;
        UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                  ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff698);
        if (bVar1) goto LAB_00ff7574;
        __gnu_cxx::__normal_iterator<CService_*,_std::vector<CService,_std::allocator<CService>_>_>
        ::operator++((__normal_iterator<CService_*,_std::vector<CService,_std::allocator<CService>_>_>
                      *)in_stack_fffffffffffff698);
      }
    }
    bVar1 = false;
LAB_00ff7574:
    std::vector<CService,_std::allocator<CService>_>::~vector
              ((vector<CService,_std::allocator<CService>_> *)in_stack_fffffffffffff6a8.__r);
    if (!bVar1) goto LAB_00ff75dc;
  }
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff6a8.__r);
LAB_00ff8616:
  if ((duration<long,_std::ratio<1L,_1000000L>_>)*(long *)(in_FS_OFFSET + 0x28) == local_8._M_i.__r)
  {
    return local_680;
  }
  __stack_chk_fail();
}

Assistant:

CNode* CConnman::ConnectNode(CAddress addrConnect, const char *pszDest, bool fCountFailure, ConnectionType conn_type, bool use_v2transport)
{
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    assert(conn_type != ConnectionType::INBOUND);

    if (pszDest == nullptr) {
        if (IsLocal(addrConnect))
            return nullptr;

        // Look for an existing connection
        CNode* pnode = FindNode(static_cast<CService>(addrConnect));
        if (pnode)
        {
            LogPrintf("Failed to open new connection, already connected\n");
            return nullptr;
        }
    }

    LogPrintLevel(BCLog::NET, BCLog::Level::Debug, "trying %s connection %s lastseen=%.1fhrs\n",
        use_v2transport ? "v2" : "v1",
        pszDest ? pszDest : addrConnect.ToStringAddrPort(),
        Ticks<HoursDouble>(pszDest ? 0h : Now<NodeSeconds>() - addrConnect.nTime));

    // Resolve
    const uint16_t default_port{pszDest != nullptr ? GetDefaultPort(pszDest) :
                                                     m_params.GetDefaultPort()};

    // Collection of addresses to try to connect to: either all dns resolved addresses if a domain name (pszDest) is provided, or addrConnect otherwise.
    std::vector<CAddress> connect_to{};
    if (pszDest) {
        std::vector<CService> resolved{Lookup(pszDest, default_port, fNameLookup && !HaveNameProxy(), 256)};
        if (!resolved.empty()) {
            std::shuffle(resolved.begin(), resolved.end(), FastRandomContext());
            // If the connection is made by name, it can be the case that the name resolves to more than one address.
            // We don't want to connect any more of them if we are already connected to one
            for (const auto& r : resolved) {
                addrConnect = CAddress{MaybeFlipIPv6toCJDNS(r), NODE_NONE};
                if (!addrConnect.IsValid()) {
                    LogDebug(BCLog::NET, "Resolver returned invalid address %s for %s\n", addrConnect.ToStringAddrPort(), pszDest);
                    return nullptr;
                }
                // It is possible that we already have a connection to the IP/port pszDest resolved to.
                // In that case, drop the connection that was just created.
                LOCK(m_nodes_mutex);
                CNode* pnode = FindNode(static_cast<CService>(addrConnect));
                if (pnode) {
                    LogPrintf("Not opening a connection to %s, already connected to %s\n", pszDest, addrConnect.ToStringAddrPort());
                    return nullptr;
                }
                // Add the address to the resolved addresses vector so we can try to connect to it later on
                connect_to.push_back(addrConnect);
            }
        } else {
            // For resolution via proxy
            connect_to.push_back(addrConnect);
        }
    } else {
        // Connect via addrConnect directly
        connect_to.push_back(addrConnect);
    }

    // Connect
    std::unique_ptr<Sock> sock;
    Proxy proxy;
    CAddress addr_bind;
    assert(!addr_bind.IsValid());
    std::unique_ptr<i2p::sam::Session> i2p_transient_session;

    for (auto& target_addr: connect_to) {
        if (target_addr.IsValid()) {
            const bool use_proxy{GetProxy(target_addr.GetNetwork(), proxy)};
            bool proxyConnectionFailed = false;

            if (target_addr.IsI2P() && use_proxy) {
                i2p::Connection conn;
                bool connected{false};

                if (m_i2p_sam_session) {
                    connected = m_i2p_sam_session->Connect(target_addr, conn, proxyConnectionFailed);
                } else {
                    {
                        LOCK(m_unused_i2p_sessions_mutex);
                        if (m_unused_i2p_sessions.empty()) {
                            i2p_transient_session =
                                std::make_unique<i2p::sam::Session>(proxy, &interruptNet);
                        } else {
                            i2p_transient_session.swap(m_unused_i2p_sessions.front());
                            m_unused_i2p_sessions.pop();
                        }
                    }
                    connected = i2p_transient_session->Connect(target_addr, conn, proxyConnectionFailed);
                    if (!connected) {
                        LOCK(m_unused_i2p_sessions_mutex);
                        if (m_unused_i2p_sessions.size() < MAX_UNUSED_I2P_SESSIONS_SIZE) {
                            m_unused_i2p_sessions.emplace(i2p_transient_session.release());
                        }
                    }
                }

                if (connected) {
                    sock = std::move(conn.sock);
                    addr_bind = CAddress{conn.me, NODE_NONE};
                }
            } else if (use_proxy) {
                LogPrintLevel(BCLog::PROXY, BCLog::Level::Debug, "Using proxy: %s to connect to %s\n", proxy.ToString(), target_addr.ToStringAddrPort());
                sock = ConnectThroughProxy(proxy, target_addr.ToStringAddr(), target_addr.GetPort(), proxyConnectionFailed);
            } else {
                // no proxy needed (none set for target network)
                sock = ConnectDirectly(target_addr, conn_type == ConnectionType::MANUAL);
            }
            if (!proxyConnectionFailed) {
                // If a connection to the node was attempted, and failure (if any) is not caused by a problem connecting to
                // the proxy, mark this as an attempt.
                addrman.Attempt(target_addr, fCountFailure);
            }
        } else if (pszDest && GetNameProxy(proxy)) {
            std::string host;
            uint16_t port{default_port};
            SplitHostPort(std::string(pszDest), port, host);
            bool proxyConnectionFailed;
            sock = ConnectThroughProxy(proxy, host, port, proxyConnectionFailed);
        }
        // Check any other resolved address (if any) if we fail to connect
        if (!sock) {
            continue;
        }

        NetPermissionFlags permission_flags = NetPermissionFlags::None;
        std::vector<NetWhitelistPermissions> whitelist_permissions = conn_type == ConnectionType::MANUAL ? vWhitelistedRangeOutgoing : std::vector<NetWhitelistPermissions>{};
        AddWhitelistPermissionFlags(permission_flags, target_addr, whitelist_permissions);

        // Add node
        NodeId id = GetNewNodeId();
        uint64_t nonce = GetDeterministicRandomizer(RANDOMIZER_ID_LOCALHOSTNONCE).Write(id).Finalize();
        if (!addr_bind.IsValid()) {
            addr_bind = GetBindAddress(*sock);
        }
        CNode* pnode = new CNode(id,
                                std::move(sock),
                                target_addr,
                                CalculateKeyedNetGroup(target_addr),
                                nonce,
                                addr_bind,
                                pszDest ? pszDest : "",
                                conn_type,
                                /*inbound_onion=*/false,
                                CNodeOptions{
                                    .permission_flags = permission_flags,
                                    .i2p_sam_session = std::move(i2p_transient_session),
                                    .recv_flood_size = nReceiveFloodSize,
                                    .use_v2transport = use_v2transport,
                                });
        pnode->AddRef();

        // We're making a new connection, harvest entropy from the time (and our peer count)
        RandAddEvent((uint32_t)id);

        return pnode;
    }

    return nullptr;
}